

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afcjk.c
# Opt level: O2

FT_Error af_cjk_hints_detect_features(AF_GlyphHints hints,AF_Dimension dim)

{
  AF_Segment *ppAVar1;
  AF_Edge *ppAVar2;
  AF_Edge *ppAVar3;
  long lVar4;
  undefined2 uVar5;
  short sVar6;
  AF_Direction AVar7;
  long lVar8;
  AF_Segment_conflict pAVar9;
  FT_Memory memory;
  AF_StyleMetrics_conflict pAVar10;
  bool bVar11;
  AF_Segment pAVar12;
  FT_Error FVar13;
  FT_Long FVar14;
  long lVar15;
  ulong uVar16;
  AF_Edge_conflict pAVar17;
  AF_Point_conflict pAVar18;
  long lVar19;
  AF_Segment_conflict pAVar20;
  AF_Edge_conflict pAVar21;
  AF_Segment_conflict pAVar22;
  ulong uVar23;
  AF_Edge_conflict pAVar24;
  AF_AxisHints axis;
  AF_AxisHints axis_00;
  AF_Segment pAVar25;
  ulong uVar26;
  byte bVar27;
  int iVar28;
  AF_Segment pAVar29;
  ushort uVar30;
  uint uVar31;
  long lVar32;
  ulong uVar33;
  int iVar34;
  long lVar35;
  AF_Segment_conflict pAVar36;
  short sVar37;
  uint uVar38;
  AF_Segment pAVar39;
  ushort uVar40;
  ulong uVar41;
  AF_Segment_conflict pAVar42;
  AF_Segment_conflict pAVar43;
  AF_Segment_conflict pAVar44;
  AF_Segment_conflict seg;
  AF_Segment_conflict pAVar45;
  int iVar46;
  AF_Edge *ppAVar47;
  AF_Edge_conflict local_60;
  AF_Edge_conflict local_38;
  
  uVar41 = (ulong)dim;
  pAVar44 = hints->axis[uVar41].segments;
  iVar28 = hints->axis[uVar41].num_segments;
  FVar13 = af_latin_hints_compute_segments(hints,dim);
  if (FVar13 == 0) {
    axis_00 = hints->axis + uVar41;
    pAVar22 = pAVar44 + iVar28;
    for (; pAVar44 < pAVar22; pAVar44 = pAVar44 + 1) {
      pAVar18 = pAVar44->first;
      uVar30 = pAVar18->flags & 3;
      bVar27 = pAVar44->flags & 0xfe;
      while (pAVar18 != pAVar44->last) {
        pAVar18 = pAVar18->next;
        uVar40 = pAVar18->flags & 3;
        if (uVar30 == 0 && uVar40 == 0) break;
        uVar30 = uVar40;
        if (pAVar18 == pAVar44->last) {
          bVar27 = pAVar44->flags | 1;
        }
      }
      pAVar44->flags = bVar27;
    }
    pAVar44 = hints->axis[uVar41].segments;
    pAVar43 = pAVar44 + axis_00->num_segments;
    AVar7 = hints->axis[uVar41].major_dir;
    uVar38 = *(uint *)&hints->metrics[1].style_class;
    uVar16 = (ulong)(dim != AF_DIMENSION_HORZ) * 0x10;
    FVar14 = FT_DivFix(0xc0,*(FT_Long *)((long)hints->axis[0].embedded.segments + (uVar16 - 0x68)));
    lVar19 = 0;
    for (pAVar22 = pAVar44; pAVar20 = pAVar44, pAVar22 < pAVar43; pAVar22 = pAVar22 + 1) {
      lVar15 = lVar19;
      if (AVar7 == pAVar22->dir) {
        for (; pAVar20 < pAVar43; pAVar20 = pAVar20 + 1) {
          if (((lVar15 != 0) && (pAVar20->dir + AVar7 == 0)) &&
             (lVar32 = (long)pAVar20->pos - (long)pAVar22->pos, -1 < lVar32)) {
            uVar5 = pAVar22->max_coord;
            sVar37 = pAVar20->min_coord;
            if (pAVar20->min_coord < pAVar22->min_coord) {
              sVar37 = pAVar22->min_coord;
            }
            sVar6 = pAVar20->max_coord;
            if ((short)uVar5 < sVar6) {
              sVar6 = uVar5;
            }
            lVar35 = (long)sVar6 - (long)sVar37;
            if ((long)(ulong)(uVar38 >> 8) <= lVar35) {
              lVar4 = lVar32 * 8;
              lVar8 = pAVar22->score;
              if ((SBORROW8(lVar4,lVar8 * 9) != lVar4 + lVar8 * -9 < 0) &&
                 ((SBORROW8(lVar4,lVar8 * 7) != lVar4 + lVar8 * -7 < 0 || (pAVar22->len < lVar35))))
              {
                pAVar22->score = lVar32;
                pAVar22->len = lVar35;
                pAVar22->link = pAVar20;
              }
              lVar8 = pAVar20->score;
              if ((SBORROW8(lVar4,lVar8 * 9) != lVar4 + lVar8 * -9 < 0) &&
                 ((SBORROW8(lVar4,lVar8 * 7) != lVar4 + lVar8 * -7 < 0 || (pAVar20->len < lVar35))))
              {
                pAVar20->score = lVar32;
                pAVar20->len = lVar35;
                pAVar20->link = pAVar22;
              }
            }
          }
          lVar15 = lVar15 + -0x50;
        }
      }
      lVar19 = lVar19 + 0x50;
    }
    for (; pAVar20 < pAVar43; pAVar20 = pAVar20 + 1) {
      pAVar22 = pAVar20->link;
      if ((pAVar22 != (AF_Segment_conflict)0x0) && (pAVar22->link == pAVar20)) {
        sVar37 = pAVar22->pos;
        sVar6 = pAVar20->pos;
        if ((sVar6 < sVar37) && (lVar19 = pAVar20->score, lVar19 < FVar14)) {
          for (pAVar36 = pAVar44; pAVar36 < pAVar43; pAVar36 = pAVar36 + 1) {
            if (((((pAVar20 != pAVar36 && pAVar36->pos <= sVar6) &&
                  (pAVar9 = pAVar36->link, pAVar9 != (AF_Segment_conflict)0x0)) &&
                 (pAVar9->link == pAVar36)) && (sVar37 <= pAVar9->pos)) &&
               (((sVar6 != pAVar36->pos || (sVar37 != pAVar9->pos)) &&
                ((lVar15 = pAVar36->score, lVar19 < lVar15 &&
                 (lVar19 * 4 - lVar15 != 0 && lVar15 <= lVar19 * 4)))))) {
              pAVar45 = pAVar44;
              if (SBORROW8(pAVar20->len,pAVar36->len * 3) != pAVar20->len + pAVar36->len * -3 < 0) {
                pAVar22->link = (AF_Segment)0x0;
                pAVar20->link = (AF_Segment)0x0;
                break;
              }
              for (; pAVar45 < pAVar43; pAVar45 = pAVar45 + 1) {
                pAVar42 = pAVar22;
                if ((pAVar45->link == pAVar36) || (pAVar42 = pAVar20, pAVar45->link == pAVar9)) {
                  pAVar45->link = (AF_Segment)0x0;
                  pAVar45->serif = pAVar42;
                }
              }
            }
          }
        }
      }
    }
    for (; pAVar44 < pAVar43; pAVar44 = pAVar44 + 1) {
      pAVar39 = pAVar44->link;
      if ((pAVar39 != (AF_Segment)0x0) && (pAVar44 != pAVar39->link)) {
        pAVar44->link = (AF_Segment)0x0;
        if ((pAVar39->score < FVar14) || (pAVar44->score < pAVar39->score * 4)) {
          pAVar44->serif = pAVar39->link;
        }
      }
    }
    memory = hints->memory;
    pAVar10 = hints->metrics;
    pAVar44 = hints->axis[uVar41].segments;
    iVar28 = axis_00->num_segments;
    hints->axis[uVar41].num_edges = 0;
    FVar14 = *(FT_Long *)((long)hints->axis[0].embedded.segments + ((uVar16 | 8) - 0x70));
    lVar19 = *(long *)((long)pAVar10 + uVar41 * 0x3838 + 0x1e8);
    lVar32 = (long)(int)FVar14;
    lVar15 = (int)lVar19 * lVar32;
    if (0x10 < (int)((ulong)(lVar15 + (lVar15 >> 0x3f) + 0x8000) >> 0x10)) {
      lVar19 = FT_DivFix(0x10,FVar14);
    }
    pAVar22 = pAVar44 + iVar28;
    for (; pAVar44 < pAVar22; pAVar44 = pAVar44 + 1) {
      uVar38 = hints->axis[uVar41].num_edges;
      uVar16 = (ulong)uVar38;
      if ((int)uVar38 < 1) {
        uVar16 = 0;
      }
      uVar23 = 0xffff;
      local_60 = (AF_Edge_conflict)0x0;
      for (uVar26 = 0; uVar26 != uVar16; uVar26 = uVar26 + 1) {
        pAVar17 = hints->axis[uVar41].edges;
        if (pAVar17[uVar26].dir == pAVar44->dir) {
          pAVar17 = pAVar17 + uVar26;
          uVar31 = (int)pAVar44->pos - (int)pAVar17->fpos;
          uVar38 = -uVar31;
          if (0 < (int)uVar31) {
            uVar38 = uVar31;
          }
          uVar33 = (ulong)uVar38 & 0xffff;
          if (uVar33 < uVar23 && (long)uVar33 < lVar19) {
            if (pAVar44->link != (AF_Segment)0x0) {
              lVar15 = 0;
              pAVar39 = pAVar17->first;
              do {
                if (pAVar39->link != (AF_Segment)0x0) {
                  sVar37 = pAVar44->link->pos;
                  sVar6 = pAVar39->link->pos;
                  iVar28 = (int)sVar6 - (int)sVar37;
                  if (sVar6 < sVar37) {
                    iVar28 = (int)sVar37 - (int)sVar6;
                  }
                  lVar15 = (long)iVar28;
                  if (lVar19 <= lVar15) break;
                }
                pAVar39 = pAVar39->edge_next;
              } while (pAVar39 != pAVar17->first);
              if (lVar19 <= lVar15) goto LAB_0017b723;
            }
            uVar23 = uVar33;
            local_60 = pAVar17;
          }
        }
LAB_0017b723:
      }
      if (local_60 == (AF_Edge_conflict)0x0) {
        FVar13 = af_axis_hints_new_edge
                           (axis_00,(int)pAVar44->pos,(int)pAVar44->dir,'\0',memory,&local_38);
        if (FVar13 != 0) {
          return FVar13;
        }
        local_38->link = (AF_Edge)0x0;
        local_38->serif = (AF_Edge)0x0;
        local_38->scale = 0;
        local_38->blue_edge = (AF_Width)0x0;
        *(undefined8 *)&local_38->score = 0;
        local_38->pos = 0;
        local_38->flags = '\0';
        local_38->dir = '\0';
        *(undefined6 *)&local_38->field_0x1a = 0;
        *(undefined8 *)local_38 = 0;
        local_38->opos = 0;
        local_38->first = pAVar44;
        local_38->last = pAVar44;
        local_38->dir = pAVar44->dir;
        sVar37 = pAVar44->pos;
        local_38->fpos = sVar37;
        lVar15 = sVar37 * lVar32;
        lVar15 = lVar15 + (lVar15 >> 0x3f) + 0x8000 >> 0x10;
        local_38->opos = lVar15;
        local_38->pos = lVar15;
        pAVar44->edge_next = pAVar44;
      }
      else {
        pAVar44->edge_next = local_60->first;
        local_60->last->edge_next = pAVar44;
        local_60->last = pAVar44;
      }
    }
    pAVar17 = hints->axis[uVar41].edges;
    pAVar21 = pAVar17 + hints->axis[uVar41].num_edges;
    for (pAVar24 = pAVar17; pAVar24 < pAVar21; pAVar24 = pAVar24 + 1) {
      pAVar39 = pAVar24->first;
      pAVar29 = pAVar39;
      if (pAVar39 != (AF_Segment)0x0) {
        do {
          pAVar29->edge = pAVar24;
          ppAVar1 = &pAVar29->edge_next;
          pAVar29 = *ppAVar1;
        } while (*ppAVar1 != pAVar39);
      }
    }
    for (; pAVar17 < pAVar21; pAVar17 = pAVar17 + 1) {
      pAVar39 = pAVar17->first;
      ppAVar2 = &pAVar17->link;
      ppAVar3 = &pAVar17->serif;
      iVar28 = 0;
      iVar34 = 0;
      pAVar29 = pAVar39;
      do {
        bVar27 = pAVar29->flags;
        pAVar25 = pAVar29->serif;
        if (pAVar25 == (AF_Segment)0x0) {
          pAVar12 = pAVar29->link;
          if (pAVar29->link != (AF_Segment)0x0) {
LAB_0017b872:
            pAVar25 = pAVar12;
            bVar11 = false;
            ppAVar47 = ppAVar2;
            goto LAB_0017b877;
          }
        }
        else if ((pAVar29->link != (AF_Segment)0x0) || (pAVar25->edge != pAVar17)) {
          pAVar12 = pAVar29->link;
          if (pAVar25->edge == pAVar17) goto LAB_0017b872;
          bVar11 = true;
          ppAVar47 = ppAVar3;
LAB_0017b877:
          pAVar24 = *ppAVar47;
          if (pAVar24 == (AF_Edge_conflict)0x0) {
LAB_0017b8bc:
            pAVar24 = pAVar25->edge;
          }
          else {
            iVar46 = (int)pAVar17->fpos - (int)pAVar24->fpos;
            uVar30 = (ushort)iVar46;
            uVar40 = -uVar30;
            if (0 < iVar46) {
              uVar40 = uVar30;
            }
            sVar37 = pAVar29->pos;
            sVar6 = pAVar25->pos;
            iVar46 = (int)sVar6 - (int)sVar37;
            if (sVar6 < sVar37) {
              iVar46 = (int)sVar37 - (int)sVar6;
            }
            if (iVar46 < (int)(uint)uVar40) goto LAB_0017b8bc;
          }
          if (bVar11) {
            *ppAVar3 = pAVar24;
            pAVar24->flags = pAVar24->flags | 2;
          }
          else {
            *ppAVar2 = pAVar24;
          }
        }
        uVar38 = bVar27 & 1;
        iVar28 = iVar28 + uVar38;
        iVar34 = iVar34 + (uint)(byte)((byte)uVar38 ^ 1);
        pAVar29 = pAVar29->edge_next;
      } while (pAVar29 != pAVar39);
      pAVar17->flags = iVar34 <= iVar28 && 0 < iVar28;
      if ((pAVar17->serif != (AF_Edge)0x0) && (*ppAVar2 != (AF_Edge)0x0)) {
        *ppAVar3 = (AF_Edge)0x0;
      }
    }
    FVar13 = 0;
  }
  return FVar13;
}

Assistant:

static FT_Error
  af_cjk_hints_detect_features( AF_GlyphHints  hints,
                                AF_Dimension   dim )
  {
    FT_Error  error;


    error = af_cjk_hints_compute_segments( hints, dim );
    if ( !error )
    {
      af_cjk_hints_link_segments( hints, dim );

      error = af_cjk_hints_compute_edges( hints, dim );
    }
    return error;
  }